

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O1

void Abc_NtkCollectNonOverlapCands
               (Abc_Obj_t *pLut,Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,Vec_Ptr_t *vCands,
               Nwk_LMPars_t *pPars)

{
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  void **ppvVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int Fill;
  int iVar12;
  Abc_Obj_t *extraout_RDX;
  Abc_Obj_t *extraout_RDX_00;
  Abc_Obj_t *pAVar13;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar14;
  uint uVar15;
  Vec_Ptr_t *vNext_00;
  long lVar16;
  int iVar17;
  
  vCands->nSize = 0;
  if (1 < pPars->nMaxSuppSize - (pLut->vFanins).nSize) {
    if (pPars->nMaxDistance < 1) {
      __assert_fail("pPars->nMaxDistance > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMerge.c"
                    ,0x98,
                    "void Abc_NtkCollectNonOverlapCands(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Nwk_LMPars_t *)"
                   );
    }
    vStart->nSize = 0;
    if (vStart->nCap == 0) {
      if (vStart->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vStart->pArray,0x80);
      }
      vStart->pArray = ppvVar7;
      vStart->nCap = 0x10;
    }
    iVar11 = vStart->nSize;
    vStart->nSize = iVar11 + 1;
    vStart->pArray[iVar11] = pLut;
    pAVar1 = pLut->pNtk;
    pAVar13 = pLut;
    if ((pAVar1->vTravIds).pArray == (int *)0x0) {
      iVar11 = pAVar1->vObjs->nSize;
      uVar14 = (long)iVar11 + 500;
      iVar12 = (int)uVar14;
      if ((pAVar1->vTravIds).nCap < iVar12) {
        piVar8 = (int *)malloc(uVar14 * 4);
        (pAVar1->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) goto LAB_002dc605;
        (pAVar1->vTravIds).nCap = iVar12;
        pAVar13 = extraout_RDX;
      }
      if (-500 < iVar11) {
        memset((pAVar1->vTravIds).pArray,0,(uVar14 & 0xffffffff) << 2);
        pAVar13 = extraout_RDX_00;
      }
      (pAVar1->vTravIds).nSize = iVar12;
    }
    iVar11 = pAVar1->nTravIds;
    pAVar1->nTravIds = iVar11 + 1;
    if (0x3ffffffe < iVar11) {
LAB_002dc5a8:
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    pAVar1 = pLut->pNtk;
    iVar11 = pAVar1->nTravIds;
    iVar12 = pLut->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,iVar12 + 1,(int)pAVar13);
    if (((long)iVar12 < 0) || ((pAVar1->vTravIds).nSize <= iVar12)) goto LAB_002dc589;
    (pAVar1->vTravIds).pArray[iVar12] = iVar11;
    iVar11 = extraout_EDX;
    if (0 < pPars->nMaxDistance) {
      iVar12 = 1;
      do {
        vNext_00 = vNext;
        Abc_NtkCollectCircle(vStart,vNext_00,pPars->nMaxFanout);
        iVar11 = extraout_EDX_00;
        if (0 < vNext_00->nSize) {
          lVar16 = 0;
          do {
            pvVar2 = vNext_00->pArray[lVar16];
            uVar15 = vCands->nCap;
            if (vCands->nSize == uVar15) {
              if ((int)uVar15 < 0x10) {
                if (vCands->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vCands->pArray,0x80);
                }
                vCands->pArray = ppvVar7;
                iVar11 = 0x10;
              }
              else {
                iVar11 = uVar15 * 2;
                if (iVar11 <= (int)uVar15) goto LAB_002dc2b8;
                if (vCands->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar15 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(vCands->pArray,(ulong)uVar15 << 4);
                }
                vCands->pArray = ppvVar7;
              }
              vCands->nCap = iVar11;
            }
LAB_002dc2b8:
            iVar17 = vCands->nSize;
            iVar11 = iVar17 + 1;
            vCands->nSize = iVar11;
            vCands->pArray[iVar17] = pvVar2;
            lVar16 = lVar16 + 1;
          } while (lVar16 < vNext_00->nSize);
        }
        bVar5 = iVar12 < pPars->nMaxDistance;
        vNext = vStart;
        vStart = vNext_00;
        iVar12 = iVar12 + 1;
      } while (bVar5);
    }
    pAVar1 = pLut->pNtk;
    if ((pAVar1->vTravIds).pArray == (int *)0x0) {
      iVar12 = pAVar1->vObjs->nSize;
      uVar14 = (long)iVar12 + 500;
      iVar17 = (int)uVar14;
      if ((pAVar1->vTravIds).nCap < iVar17) {
        piVar8 = (int *)malloc(uVar14 * 4);
        (pAVar1->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_002dc605:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar1->vTravIds).nCap = iVar17;
        iVar11 = extraout_EDX_01;
      }
      if (-500 < iVar12) {
        memset((pAVar1->vTravIds).pArray,0,(uVar14 & 0xffffffff) << 2);
        iVar11 = extraout_EDX_02;
      }
      (pAVar1->vTravIds).nSize = iVar17;
    }
    iVar12 = pAVar1->nTravIds;
    pAVar1->nTravIds = iVar12 + 1;
    if (0x3ffffffe < iVar12) goto LAB_002dc5a8;
    iVar12 = pPars->fUseTfiTfo;
    pAVar1 = pLut->pNtk;
    iVar17 = pAVar1->nTravIds;
    uVar15 = pLut->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,uVar15 + 1,iVar11);
    if (iVar12 == 0) {
      if (((int)uVar15 < 0) || ((pAVar1->vTravIds).nSize <= (int)uVar15)) {
LAB_002dc589:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar1->vTravIds).pArray[uVar15] = iVar17 + -1;
      Abc_NtkMarkFanins_rec(pLut,(*(uint *)&pLut->field_0x14 >> 0xc) - pPars->nMaxDistance);
      pAVar1 = pLut->pNtk;
      iVar11 = pAVar1->nTravIds;
      iVar12 = pLut->Id;
      Vec_IntFillExtra(&pAVar1->vTravIds,iVar12 + 1,Fill);
      if (((long)iVar12 < 0) || ((pAVar1->vTravIds).nSize <= iVar12)) goto LAB_002dc589;
      (pAVar1->vTravIds).pArray[iVar12] = iVar11 + -1;
      Abc_NtkMarkFanouts_rec
                (pLut,(*(uint *)&pLut->field_0x14 >> 0xc) + pPars->nMaxDistance,pPars->nMaxFanout);
      uVar14 = extraout_RDX_02;
    }
    else {
      if (((int)uVar15 < 0) || ((pAVar1->vTravIds).nSize <= (int)uVar15)) goto LAB_002dc589;
      (pAVar1->vTravIds).pArray[uVar15] = iVar17;
      uVar14 = extraout_RDX_01;
    }
    iVar11 = vCands->nSize;
    if (iVar11 < 1) {
      uVar15 = 0;
    }
    else {
      lVar16 = 0;
      uVar15 = 0;
      do {
        plVar3 = (long *)vCands->pArray[lVar16];
        lVar4 = *plVar3;
        iVar11 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar11 + 1,(int)uVar14);
        if (((long)iVar11 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar14 = extraout_RDX_03;
        if (((*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar11 * 4) != *(int *)(*plVar3 + 0xd8)) &&
            (*(int *)((long)plVar3 + 0x1c) + (pLut->vFanins).nSize <= pPars->nMaxSuppSize)) &&
           (uVar6 = *(uint *)&pLut->field_0x14 >> 0xc, uVar9 = *(uint *)((long)plVar3 + 0x14) >> 0xc
           , iVar12 = uVar6 - uVar9, iVar11 = pPars->nMaxLevelDiff,
           uVar14 = (ulong)CONCAT31((int3)((uint)iVar12 >> 8),iVar11 < iVar12),
           (int)(uVar9 - uVar6) <= iVar11 && iVar11 >= iVar12)) {
          if (((int)uVar15 < 0) || (vCands->nSize <= (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          uVar10 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          vCands->pArray[uVar10] = plVar3;
        }
        lVar16 = lVar16 + 1;
        iVar11 = vCands->nSize;
      } while (lVar16 < iVar11);
    }
    if (iVar11 < (int)uVar15) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vCands->nSize = uVar15;
  }
  return;
}

Assistant:

void Abc_NtkCollectNonOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Vec_Ptr_t * vTemp;
    Abc_Obj_t * pObj;
    int i, k;
    Vec_PtrClear( vCands );
    if ( pPars->nMaxSuppSize - Abc_ObjFaninNum(pLut) <= 1 )
        return;

    // collect nodes removed by this distance
    assert( pPars->nMaxDistance > 0 );
    Vec_PtrClear( vStart );
    Vec_PtrPush( vStart, pLut );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    for ( i = 1; i <= pPars->nMaxDistance; i++ )
    {
        Abc_NtkCollectCircle( vStart, vNext, pPars->nMaxFanout );
        vTemp  = vStart;
        vStart = vNext;
        vNext  = vTemp;
        // collect the nodes in vStart
        Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, k )
            Vec_PtrPush( vCands, pObj );
    }

    // mark the TFI/TFO nodes
    Abc_NtkIncrementTravId( pLut->pNtk );
    if ( pPars->fUseTfiTfo )
        Abc_NodeSetTravIdCurrent( pLut );
    else
    {
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanins_rec( pLut, Abc_ObjLevel(pLut) - pPars->nMaxDistance );
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanouts_rec( pLut, Abc_ObjLevel(pLut) + pPars->nMaxDistance, pPars->nMaxFanout );
    }

    // collect nodes satisfying the following conditions:
    // - they are close enough in terms of distance
    // - they are not in the TFI/TFO of the LUT
    // - they have no more than the given number of fanins
    // - they have no more than the given diff in delay
    k = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCands, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pLut) + Abc_ObjFaninNum(pObj) > pPars->nMaxSuppSize )
            continue;
        if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
             Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
             continue;
        Vec_PtrWriteEntry( vCands, k++, pObj );
    }
    Vec_PtrShrink( vCands, k );
}